

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.h
# Opt level: O0

void __thiscall CompilationContext::Poolable::Poolable(Poolable *this,CompilationContext *ctx_)

{
  vector<CompilationContext::Poolable_*,_std::allocator<CompilationContext::Poolable_*>_> *in_RSI;
  value_type *in_RDI;
  
  *in_RDI = (value_type)in_RSI;
  std::vector<CompilationContext::Poolable_*,_std::allocator<CompilationContext::Poolable_*>_>::
  push_back(in_RSI,in_RDI);
  return;
}

Assistant:

Poolable(CompilationContext & ctx_) : ctx(ctx_)
    {
      ctx.poolableObjects.push_back(this);
    }